

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transform_multi_assign_reference.cpp
# Opt level: O1

unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true> __thiscall
duckdb::Transformer::TransformMultiAssignRef(Transformer *this,PGMultiAssignRef *root)

{
  int *piVar1;
  long lVar2;
  char *__s;
  bool bVar3;
  size_t sVar4;
  ParserException *pPVar5;
  long in_RDX;
  long lVar6;
  long lVar7;
  optional_ptr<duckdb_libpgquery::PGValue,_true> function;
  string local_98;
  string local_78;
  string local_58;
  optional_ptr<duckdb_libpgquery::PGValue,_true> local_38;
  
  piVar1 = *(int **)(in_RDX + 8);
  if (*piVar1 == 0x165) {
    lVar2 = *(long *)(piVar1 + 4);
    local_38.ptr = (PGValue *)**(long **)(*(long *)(piVar1 + 2) + 0x10);
    optional_ptr<duckdb_libpgquery::PGValue,_true>::CheckValid(&local_38);
    __s = ((local_38.ptr)->val).str;
    if (__s == (char *)0x0) {
      bVar3 = true;
    }
    else {
      local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
      sVar4 = strlen(__s);
      ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,__s,__s + sVar4);
      local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"row","");
      bVar3 = StringUtil::CIEquals(&local_58,&local_78);
      bVar3 = !bVar3;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_78._M_dataplus._M_p != &local_78.field_2) {
        operator_delete(local_78._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_58._M_dataplus._M_p != &local_58.field_2) {
        operator_delete(local_58._M_dataplus._M_p);
      }
    }
    if (!bVar3) {
      if (lVar2 == 0) {
        lVar7 = 0;
      }
      else {
        lVar7 = (long)*(int *)(lVar2 + 4);
        if (lVar7 <= *(int *)(in_RDX + 0x14)) {
          lVar7 = lVar2;
          lVar6 = 1;
          do {
            lVar7 = *(long *)(lVar7 + 8);
            if (lVar7 == 0) break;
            bVar3 = lVar6 < *(int *)(in_RDX + 0x10);
            lVar6 = lVar6 + 1;
          } while (bVar3);
          if (lVar7 == 0) {
            pPVar5 = (ParserException *)__cxa_allocate_exception(0x10);
            local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
            ::std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_98,
                       "Could not perform assignment, expected %d values, got %d","");
            ParserException::ParserException<int,int>
                      (pPVar5,&local_98,*(int *)(in_RDX + 0x14),*(int *)(lVar2 + 4));
            __cxa_throw(pPVar5,&ParserException::typeinfo,::std::runtime_error::~runtime_error);
          }
          goto LAB_00e9bc27;
        }
      }
      pPVar5 = (ParserException *)__cxa_allocate_exception(0x10);
      local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_98,"Could not perform assignment, expected %d values, got %d","");
      ParserException::ParserException<int,long>(pPVar5,&local_98,*(int *)(in_RDX + 0x14),lVar7);
      __cxa_throw(pPVar5,&ParserException::typeinfo,::std::runtime_error::~runtime_error);
    }
  }
LAB_00e9bc27:
  TransformExpression(this,(optional_ptr<duckdb_libpgquery::PGNode,_true>)root);
  return (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>)
         (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>)this;
}

Assistant:

unique_ptr<ParsedExpression> Transformer::TransformMultiAssignRef(duckdb_libpgquery::PGMultiAssignRef &root) {

	// Early-out, if the root is not a function call.
	if (root.source->type != duckdb_libpgquery::T_PGFuncCall) {
		return TransformExpression(root.source);
	}

	auto func = PGCast<duckdb_libpgquery::PGFuncCall>(*root.source);

	// Only allow ROW function.
	auto function = PGPointerCast<duckdb_libpgquery::PGValue>(func.funcname->tail->data.ptr_value);
	char const *function_name = function->val.str;
	if (!function_name || !StringUtil::CIEquals(function_name, "row")) {
		return TransformExpression(root.source);
	}

	// Too many columns, e.g., (x, y) != (1, 2, 3).
	int64_t value_count = func.args ? func.args->length : 0;
	if (int64_t(root.ncolumns) < value_count || !func.args) {
		throw ParserException("Could not perform assignment, expected %d values, got %d", root.ncolumns, value_count);
	}

	// Get the expression corresponding with the current column.
	int64_t idx = 1;
	auto list = func.args->head;
	while (list && idx < int64_t(root.colno)) {
		list = list->next;
		++idx;
	}

	// Not enough columns, e.g., (x, y, z) != (1, 2).
	if (!list) {
		throw ParserException("Could not perform assignment, expected %d values, got %d", root.ncolumns,
		                      func.args->length);
	}

	auto node = PGPointerCast<duckdb_libpgquery::PGNode>(list->data.ptr_value);
	return TransformExpression(node);
}